

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::pattern_formatter::handle_flag_<spdlog::details::scoped_padder>
          (pattern_formatter *this,char flag,padding_info padding)

{
  pointer __p;
  iterator iVar1;
  ulong uVar2;
  size_t sVar3;
  pointer *__ptr;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_48;
  byte local_39;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_38;
  padding_info local_30;
  
  uVar2 = padding._8_8_;
  sVar3 = padding.width_;
  local_30.width_._0_6_ = (undefined6)padding.width_;
  local_30.width_._6_2_ = padding.width_._6_2_;
  local_30.side_ = padding.side_;
  local_30.truncate_ = padding.truncate_;
  local_30.enabled_ = padding.enabled_;
  local_30._14_2_ = padding._14_2_;
  local_39 = flag;
  iVar1 = std::
          _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->custom_handlers_)._M_h,(key_type *)&local_39);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    (**(code **)(**(long **)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_false>
                                   ._M_cur + 0x10) + 0x18))(&local_48);
    local_38._M_head_impl = local_48._M_head_impl;
    *(ulong *)((long)&((local_48._M_head_impl)->padinfo_).width_ + 6) =
         CONCAT17(local_30.enabled_,
                  CONCAT16(local_30.truncate_,CONCAT42(local_30.side_,local_30.width_._6_2_)));
    ((local_48._M_head_impl)->padinfo_).width_ =
         CONCAT26(local_30.width_._6_2_,(undefined6)local_30.width_);
    local_48._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_38);
    if (local_38._M_head_impl != (flag_formatter *)0x0) {
      (*(local_38._M_head_impl)->_vptr_flag_formatter[1])();
    }
    goto LAB_001634c7;
  }
  switch(local_39) {
  case 0x21:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1f48;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  default:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x38);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)0x0;
    ((local_48._M_head_impl)->padinfo_).width_ = 0;
    ((local_48._M_head_impl)->padinfo_).side_ = left;
    ((local_48._M_head_impl)->padinfo_).truncate_ = false;
    ((local_48._M_head_impl)->padinfo_).enabled_ = false;
    *(undefined2 *)&((local_48._M_head_impl)->padinfo_).field_0xe = 0;
    local_48._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    local_48._M_head_impl[1].padinfo_.width_ = 0;
    local_48._M_head_impl[1].padinfo_.side_ = left;
    local_48._M_head_impl[1].padinfo_.truncate_ = false;
    local_48._M_head_impl[1].padinfo_.enabled_ = false;
    *(undefined2 *)&local_48._M_head_impl[1].padinfo_.field_0xe = 0;
    local_48._M_head_impl[2]._vptr_flag_formatter = (_func_int **)0x0;
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__aggregate_formatter_001b2a88
    ;
    local_48._M_head_impl[1]._vptr_flag_formatter =
         (_func_int **)&local_48._M_head_impl[1].padinfo_.side_;
    if ((uVar2 >> 0x20 & 1) == 0) {
      std::__cxx11::string::push_back((char)local_48._M_head_impl + '\x18');
      std::__cxx11::string::push_back((char)local_48._M_head_impl + '\x18');
      local_38._M_head_impl = local_48._M_head_impl;
      local_48._M_head_impl = (flag_formatter *)0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_38);
    }
    else {
      local_30.truncate_ = false;
      local_38._M_head_impl = (flag_formatter *)operator_new(0x18);
      ((local_38._M_head_impl)->padinfo_).width_ = sVar3;
      ((local_38._M_head_impl)->padinfo_).side_ = local_30.side_;
      ((local_38._M_head_impl)->padinfo_).truncate_ = local_30.truncate_;
      ((local_38._M_head_impl)->padinfo_).enabled_ = local_30.enabled_;
      *(undefined2 *)&((local_38._M_head_impl)->padinfo_).field_0xe = local_30._14_2_;
      (local_38._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1f48;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_38);
      if (local_38._M_head_impl != (flag_formatter *)0x0) {
        (*(local_38._M_head_impl)->_vptr_flag_formatter[1])();
      }
      std::__cxx11::string::push_back((char)local_48._M_head_impl + '\x18');
      local_38._M_head_impl = local_48._M_head_impl;
      local_48._M_head_impl = (flag_formatter *)0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_38);
    }
    if (local_38._M_head_impl != (flag_formatter *)0x0) {
      (*(local_38._M_head_impl)->_vptr_flag_formatter[1])();
    }
    if ((aggregate_formatter *)local_48._M_head_impl == (aggregate_formatter *)0x0) {
      return;
    }
    std::default_delete<spdlog::details::aggregate_formatter>::operator()
              ((default_delete<spdlog::details::aggregate_formatter> *)&local_48,
               (aggregate_formatter *)local_48._M_head_impl);
    return;
  case 0x23:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1f08;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x24:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1e08;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x25:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x20);
    ((local_48._M_head_impl)->padinfo_).width_ = 0;
    *(undefined8 *)((long)&((local_48._M_head_impl)->padinfo_).width_ + 6) = 0;
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1f88;
    *(undefined1 *)&local_48._M_head_impl[1]._vptr_flag_formatter = 0x25;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x26:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b20c8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x2b:
    details::make_unique<spdlog::details::full_formatter,spdlog::details::padding_info&>
              ((details *)&local_38,&local_30);
    local_48._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    if (local_48._M_head_impl != (flag_formatter *)0x0) {
      (*(local_48._M_head_impl)->_vptr_flag_formatter[1])();
    }
    local_48._M_head_impl = (flag_formatter *)0x0;
    if ((full_formatter *)local_38._M_head_impl != (full_formatter *)0x0) {
      std::default_delete<spdlog::details::full_formatter>::operator()
                ((default_delete<spdlog::details::full_formatter> *)&local_38,
                 (full_formatter *)local_38._M_head_impl);
    }
    goto LAB_00163dbb;
  case 0x40:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1e48;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x41:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1808;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x42:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1888;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x43:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1908;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x44:
  case 0x78:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1988;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x45:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1c08;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x46:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1bc8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x48:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1a48;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x49:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1a88;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x4c:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1708;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x4d:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1ac8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x4f:
    details::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1l>>>,spdlog::details::padding_info&>
              ((details *)&local_38,&local_30);
    local_48._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_00163e68;
  case 0x50:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1d88;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x52:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1cc8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x53:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1b08;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x54:
  case 0x58:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1d08;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x59:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1948;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x5e:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1dc8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x61:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b17c8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x62:
  case 0x68:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1848;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 99:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b18c8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 100:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1a08;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x65:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1b48;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x66:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1b88;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x67:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1ec8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x69:
    details::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000l>>>,spdlog::details::padding_info&>
              ((details *)&local_38,&local_30);
    local_48._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_00163e68;
  case 0x6c:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b16c8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x6d:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b19c8;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x6e:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1688;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x6f:
    details::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000l>>>,spdlog::details::padding_info&>
              ((details *)&local_38,&local_30);
    local_48._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_00163e68;
  case 0x70:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1c48;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x72:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1c88;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    break;
  case 0x73:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1e88;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x74:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1748;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
    goto LAB_001634c7;
  case 0x75:
    details::
    make_unique<spdlog::details::elapsed_formatter<spdlog::details::scoped_padder,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,spdlog::details::padding_info&>
              ((details *)&local_38,&local_30);
    local_48._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
LAB_00163e68:
    if (local_48._M_head_impl != (flag_formatter *)0x0) {
      (*(local_48._M_head_impl)->_vptr_flag_formatter[1])();
    }
    local_48._M_head_impl = (flag_formatter *)0x0;
    if (local_38._M_head_impl == (flag_formatter *)0x0) {
      return;
    }
    operator_delete(local_38._M_head_impl);
    return;
  case 0x76:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1788;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
LAB_001634c7:
    if (local_48._M_head_impl != (flag_formatter *)0x0) {
      (*(local_48._M_head_impl)->_vptr_flag_formatter[1])();
    }
    return;
  case 0x7a:
    local_48._M_head_impl = (flag_formatter *)operator_new(0x28);
    ((local_48._M_head_impl)->padinfo_).width_ = sVar3;
    ((local_48._M_head_impl)->padinfo_).side_ = (int)uVar2;
    ((local_48._M_head_impl)->padinfo_).truncate_ = (bool)(char)(uVar2 >> 0x20);
    ((local_48._M_head_impl)->padinfo_).enabled_ = (bool)(char)(uVar2 >> 0x28);
    *(short *)&((local_48._M_head_impl)->padinfo_).field_0xe = (short)(uVar2 >> 0x30);
    (local_48._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001b1d48;
    local_48._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    *(undefined4 *)&local_48._M_head_impl[1].padinfo_.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_48);
  }
  if (local_48._M_head_impl != (flag_formatter *)0x0) {
    (*(local_48._M_head_impl)->_vptr_flag_formatter[1])();
  }
LAB_00163dbb:
  this->need_localtime_ = true;
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::handle_flag_(char flag, details::padding_info padding) {
    // process custom flags
    auto it = custom_handlers_.find(flag);
    if (it != custom_handlers_.end()) {
        auto custom_handler = it->second->clone();
        custom_handler->set_padding_info(padding);
        formatters_.push_back(std::move(custom_handler));
        return;
    }

    // process built-in flags
    switch (flag) {
        case ('+'):  // default formatter
            formatters_.push_back(details::make_unique<details::full_formatter>(padding));
            need_localtime_ = true;
            break;

        case 'n':  // logger name
            formatters_.push_back(details::make_unique<details::name_formatter<Padder>>(padding));
            break;

        case 'l':  // level
            formatters_.push_back(details::make_unique<details::level_formatter<Padder>>(padding));
            break;

        case 'L':  // short level
            formatters_.push_back(
                details::make_unique<details::short_level_formatter<Padder>>(padding));
            break;

        case ('t'):  // thread id
            formatters_.push_back(details::make_unique<details::t_formatter<Padder>>(padding));
            break;

        case ('v'):  // the message text
            formatters_.push_back(details::make_unique<details::v_formatter<Padder>>(padding));
            break;

        case ('a'):  // weekday
            formatters_.push_back(details::make_unique<details::a_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('A'):  // short weekday
            formatters_.push_back(details::make_unique<details::A_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('b'):
        case ('h'):  // month
            formatters_.push_back(details::make_unique<details::b_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('B'):  // short month
            formatters_.push_back(details::make_unique<details::B_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('c'):  // datetime
            formatters_.push_back(details::make_unique<details::c_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('C'):  // year 2 digits
            formatters_.push_back(details::make_unique<details::C_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('Y'):  // year 4 digits
            formatters_.push_back(details::make_unique<details::Y_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('D'):
        case ('x'):  // datetime MM/DD/YY
            formatters_.push_back(details::make_unique<details::D_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('m'):  // month 1-12
            formatters_.push_back(details::make_unique<details::m_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('d'):  // day of month 1-31
            formatters_.push_back(details::make_unique<details::d_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('H'):  // hours 24
            formatters_.push_back(details::make_unique<details::H_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('I'):  // hours 12
            formatters_.push_back(details::make_unique<details::I_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('M'):  // minutes
            formatters_.push_back(details::make_unique<details::M_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('S'):  // seconds
            formatters_.push_back(details::make_unique<details::S_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('e'):  // milliseconds
            formatters_.push_back(details::make_unique<details::e_formatter<Padder>>(padding));
            break;

        case ('f'):  // microseconds
            formatters_.push_back(details::make_unique<details::f_formatter<Padder>>(padding));
            break;

        case ('F'):  // nanoseconds
            formatters_.push_back(details::make_unique<details::F_formatter<Padder>>(padding));
            break;

        case ('E'):  // seconds since epoch
            formatters_.push_back(details::make_unique<details::E_formatter<Padder>>(padding));
            break;

        case ('p'):  // am/pm
            formatters_.push_back(details::make_unique<details::p_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('r'):  // 12 hour clock 02:55:02 pm
            formatters_.push_back(details::make_unique<details::r_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('R'):  // 24-hour HH:MM time
            formatters_.push_back(details::make_unique<details::R_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('T'):
        case ('X'):  // ISO 8601 time format (HH:MM:SS)
            formatters_.push_back(details::make_unique<details::T_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('z'):  // timezone
            formatters_.push_back(details::make_unique<details::z_formatter<Padder>>(padding));
            need_localtime_ = true;
            break;

        case ('P'):  // pid
            formatters_.push_back(details::make_unique<details::pid_formatter<Padder>>(padding));
            break;

        case ('^'):  // color range start
            formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
            break;

        case ('$'):  // color range end
            formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
            break;

        case ('@'):  // source location (filename:filenumber)
            formatters_.push_back(
                details::make_unique<details::source_location_formatter<Padder>>(padding));
            break;

        case ('s'):  // short source filename - without directory name
            formatters_.push_back(
                details::make_unique<details::short_filename_formatter<Padder>>(padding));
            break;

        case ('g'):  // full source filename
            formatters_.push_back(
                details::make_unique<details::source_filename_formatter<Padder>>(padding));
            break;

        case ('#'):  // source line number
            formatters_.push_back(
                details::make_unique<details::source_linenum_formatter<Padder>>(padding));
            break;

        case ('!'):  // source funcname
            formatters_.push_back(
                details::make_unique<details::source_funcname_formatter<Padder>>(padding));
            break;

        case ('%'):  // % char
            formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
            break;

        case ('u'):  // elapsed time since last log message in nanos
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::nanoseconds>>(
                    padding));
            break;

        case ('i'):  // elapsed time since last log message in micros
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::microseconds>>(
                    padding));
            break;

        case ('o'):  // elapsed time since last log message in millis
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::milliseconds>>(
                    padding));
            break;

        case ('O'):  // elapsed time since last log message in seconds
            formatters_.push_back(
                details::make_unique<details::elapsed_formatter<Padder, std::chrono::seconds>>(
                    padding));
            break;

        case ('&'):
            formatters_.push_back(details::make_unique<details::mdc_formatter<Padder>>(padding));
            break;

        default:  // Unknown flag appears as is
            auto unknown_flag = details::make_unique<details::aggregate_formatter>();

            if (!padding.truncate_) {
                unknown_flag->add_ch('%');
                unknown_flag->add_ch(flag);
                formatters_.push_back((std::move(unknown_flag)));
            }
            // fix issue #1617 (prev char was '!' and should have been treated as funcname flag
            // instead of truncating flag) spdlog::set_pattern("[%10!] %v") => "[      main] some
            // message" spdlog::set_pattern("[%3!!] %v") => "[mai] some message"
            else {
                padding.truncate_ = false;
                formatters_.push_back(
                    details::make_unique<details::source_funcname_formatter<Padder>>(padding));
                unknown_flag->add_ch(flag);
                formatters_.push_back((std::move(unknown_flag)));
            }

            break;
    }
}